

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

int __thiscall
GF2::MP<6UL,_GF2::MOGrlex<6UL>_>::Compare
          (MP<6UL,_GF2::MOGrlex<6UL>_> *this,MP<6UL,_GF2::MOGrlex<6UL>_> *polyRight)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  p_Var4 = (_List_node_base *)this;
  p_Var5 = (_List_node_base *)polyRight;
  while( true ) {
    p_Var4 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var4->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var5 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var5->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if ((p_Var4 == (_List_node_base *)this) || (p_Var5 == (_List_node_base *)polyRight)) {
      if (p_Var4 != (_List_node_base *)this) {
        return 1;
      }
      return -(uint)(p_Var5 != (_List_node_base *)polyRight);
    }
    uVar1 = *(ulong *)(p_Var4 + 1);
    uVar2 = *(ulong *)(p_Var5 + 1);
    if ((&WW<6ul>::Weight()::_bitsperoctet)[uVar1 & 0xff] !=
        (&WW<6ul>::Weight()::_bitsperoctet)[uVar2 & 0xff]) break;
    if (uVar1 != uVar2) {
      uVar3 = (uVar2 < uVar1) - 1;
LAB_00133041:
      return uVar3 | 1;
    }
  }
  uVar3 = -(uint)((byte)(&WW<6ul>::Weight()::_bitsperoctet)[uVar1 & 0xff] <
                 (byte)(&WW<6ul>::Weight()::_bitsperoctet)[uVar2 & 0xff]);
  goto LAB_00133041;
}

Assistant:

int Compare(const MP& polyRight) const
	{
		assert(IsConsistent(polyRight));
		// цикл по мономам
		const_iterator iter = begin(), iterRight = polyRight.begin();
		for (; iter != end() && iterRight != polyRight.end(); ++iter, ++iterRight)
			if (int cmp = _order.Compare(*iter, *iterRight))
				return cmp;
		// проверка хвостов
		if (iter == end()) 
			return iterRight == polyRight.end() ? 0 : -1;
        return 1;
	}